

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffreopen(fitsfile *openfptr,fitsfile **newfptr,int *status)

{
  fitsfile *pfVar1;
  int *status_local;
  fitsfile **newfptr_local;
  fitsfile *openfptr_local;
  
  if (*status < 1) {
    if (openfptr == (fitsfile *)0x0) {
      *status = 0x73;
      openfptr_local._4_4_ = 0x73;
    }
    else if (openfptr->Fptr->validcode == 0x22b) {
      pfVar1 = (fitsfile *)calloc(1,0x10);
      *newfptr = pfVar1;
      (*newfptr)->Fptr = openfptr->Fptr;
      (*newfptr)->HDUposition = 0;
      (*newfptr)->Fptr->open_count = (*newfptr)->Fptr->open_count + 1;
      openfptr_local._4_4_ = *status;
    }
    else {
      *status = 0x72;
      openfptr_local._4_4_ = 0x72;
    }
  }
  else {
    openfptr_local._4_4_ = *status;
  }
  return openfptr_local._4_4_;
}

Assistant:

int ffreopen(fitsfile *openfptr, /* I - FITS file pointer to open file  */ 
             fitsfile **newfptr,  /* O - pointer to new re opened file   */
             int *status)        /* IO - error status                   */
/*
  Reopen an existing FITS file with either readonly or read/write access.
  The reopened file shares the same FITSfile structure but may point to a
  different HDU within the file.
*/
{
    if (*status > 0)
        return(*status);

    /* check that the open file pointer is valid */
    if (!openfptr)
        return(*status = NULL_INPUT_PTR);
    else if ((openfptr->Fptr)->validcode != VALIDSTRUC) /* check magic value */
        return(*status = BAD_FILEPTR); 

        /* allocate fitsfile structure and initialize = 0 */
    *newfptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    (*newfptr)->Fptr = openfptr->Fptr; /* both point to the same structure */
    (*newfptr)->HDUposition = 0;  /* set initial position to primary array */
    (((*newfptr)->Fptr)->open_count)++;   /* increment the file usage counter */

    return(*status);
}